

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateReflectionInitializationCode
          (FileGenerator *this,Printer *p)

{
  FileGenerator *pFVar1;
  MessageFactory MVar2;
  btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
  bVar3;
  FileDescriptor *file;
  pointer puVar4;
  long lVar5;
  DescriptorPool *pDVar6;
  vector *pvVar7;
  MessageFactory *pMVar8;
  Printer *pPVar9;
  size_type sVar10;
  undefined8 uVar11;
  bool bVar12;
  char cVar13;
  FileOptions_OptimizeMode FVar14;
  int iVar15;
  mapped_type pDVar16;
  long lVar17;
  mapped_type *ppDVar18;
  Arena *pAVar19;
  reference ppVar20;
  string *psVar21;
  Message *extraout_RDX;
  long *plVar22;
  _Alloc_hider _Var23;
  pointer puVar24;
  char *pcVar25;
  size_t sVar26;
  long lVar27;
  long lVar28;
  int i;
  int iVar29;
  initializer_list<const_google::protobuf::Message_*> __l;
  const_iterator other;
  string_view name;
  string_view name_00;
  string_view filename;
  string_view filename_00;
  iterator iVar30;
  btree_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>_>
  res;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  size_t num_deps;
  string file_data;
  string desc_name;
  DynamicMessageFactory factory;
  CrossFileReferences refs;
  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  to_process;
  FileDescriptorProto file_proto;
  Options *in_stack_fffffffffffff6a8;
  Printer *local_940;
  Options *local_938;
  anon_class_1_0_00000001 local_929;
  string local_928;
  long *local_908;
  undefined1 local_900 [32];
  pointer local_8e0;
  AlphaNum local_8d8;
  unsigned_long local_8a0;
  string local_898;
  FileGenerator *local_878;
  MaybeInitializedPtr local_870;
  undefined1 local_868 [16];
  HeapOrSoo local_858;
  ctrl_t local_848;
  undefined7 uStack_847;
  TypeErasedState *local_838;
  AccessInfoMap *local_830;
  TypeErasedState local_828;
  TypeErasedState *local_818;
  AccessInfoMap *local_810;
  TypeErasedState local_808;
  char *local_7f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7f0;
  FileGenerator *local_7d8;
  undefined1 local_7d0 [16];
  _Alloc_hider _Stack_7c0;
  char *local_7b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7b0;
  _Alloc_hider _Stack_7a0;
  string local_798;
  string local_778;
  string local_758;
  string local_738;
  string local_718;
  string local_6f8;
  string local_6d8;
  _Alloc_hider local_6b8;
  string local_6b0;
  HeapOrSoo local_690;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_680;
  string local_670;
  string local_650;
  string local_630;
  undefined1 local_610 [32];
  AlphaNum local_5f0;
  CrossFileReferences local_5b0;
  HeapOrSoo local_568;
  undefined1 local_558 [32];
  pointer local_538;
  pointer local_530;
  byte local_528;
  _Alloc_hider local_520;
  pointer local_518;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_510;
  undefined1 local_500;
  _Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> local_4f8;
  undefined1 local_4b0 [48];
  undefined1 local_480 [16];
  bool local_470;
  _Alloc_hider local_468;
  size_t local_460;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  bool local_448;
  bool local_400;
  Sub local_3f8;
  Sub local_340;
  Sub local_288;
  Sub local_1d0;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_118 [9];
  
  local_940 = p;
  if ((this->enum_generators_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->enum_generators_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    google::protobuf::io::Printer::Emit
              (p,0,0,0x6d,
               "\n      static constexpr const ::_pb::EnumDescriptor**\n          $file_level_enum_descriptors$ = nullptr;\n    "
              );
  }
  else {
    local_610._0_8_ = local_610 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_610,"len","");
    local_118[0].
    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((long)(this->enum_generators_).
                         super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->enum_generators_).
                         super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
    io::Printer::Sub::Sub<unsigned_long>
              ((Sub *)&local_568.heap,(string *)local_610,(unsigned_long *)local_118);
    google::protobuf::io::Printer::Emit
              (p,&local_568,1,0x55,
               "\n      static const ::_pb::EnumDescriptor* $file_level_enum_descriptors$[$len$];\n    "
              );
    if (local_4f8._M_engaged == true) {
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                (&local_4f8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_520._M_p != &local_510) {
      operator_delete(local_520._M_p,
                      CONCAT71(local_510._M_allocated_capacity._1_7_,local_510._M_local_buf[0]) + 1)
      ;
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[local_528]._M_data)
              ((anon_class_1_0_00000001 *)&local_5b0,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)(local_558 + 0x10));
    local_528 = 0xff;
    if ((FileGenerator *)local_568.heap.control != (FileGenerator *)local_558) {
      operator_delete(local_568.heap.control,(ulong)(local_558._0_8_ + 1));
    }
    if ((undefined1 *)local_610._0_8_ != local_610 + 0x10) {
      operator_delete((void *)local_610._0_8_,local_610._16_8_ + 1);
    }
  }
  file = this->file_;
  local_938 = &this->options_;
  if ((((*(int *)(file + 0x44) < 1) ||
       (FVar14 = GetOptimizeFor(file,local_938,(bool *)0x0), pPVar9 = local_940,
       FVar14 == FileOptions_OptimizeMode_LITE_RUNTIME)) ||
      (*(char *)(*(long *)(file + 0x80) + 0xa3) != '\x01')) || (*(int *)(this->file_ + 0x44) < 1)) {
    google::protobuf::io::Printer::Emit
              (local_940,0,0,0x73,
               "\n      static constexpr const ::_pb::ServiceDescriptor**\n          $file_level_service_descriptors$ = nullptr;\n    "
              );
  }
  else {
    local_630._M_dataplus._M_p = (pointer)&local_630.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_630,"len","");
    local_118[0].
    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_118[0].
                           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                           *(undefined4 *)(this->file_ + 0x44));
    io::Printer::Sub::Sub<int>((Sub *)&local_568.heap,&local_630,(int *)local_118);
    google::protobuf::io::Printer::Emit
              (pPVar9,&local_568,1,0x65,
               "\n      static const ::_pb::ServiceDescriptor*\n          $file_level_service_descriptors$[$len$];\n    "
              );
    if (local_4f8._M_engaged == true) {
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                (&local_4f8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_520._M_p != &local_510) {
      operator_delete(local_520._M_p,
                      CONCAT71(local_510._M_allocated_capacity._1_7_,local_510._M_local_buf[0]) + 1)
      ;
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[local_528]._M_data)
              ((anon_class_1_0_00000001 *)&local_5b0,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)(local_558 + 0x10));
    local_528 = 0xff;
    if ((FileGenerator *)local_568.heap.control != (FileGenerator *)local_558) {
      operator_delete(local_568.heap.control,(ulong)(local_558._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_630._M_dataplus._M_p != &local_630.field_2) {
      operator_delete(local_630._M_dataplus._M_p,local_630.field_2._M_allocated_capacity + 1);
    }
  }
  puVar24 = (this->message_generators_).
            super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = (this->message_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar24 == puVar4) {
    google::protobuf::io::Printer::Emit
              (local_940,0,0,0xcd,
               "\n      const ::uint32_t $tablename$::offsets[1] = {};\n      static constexpr ::_pbi::MigrationSchema* schemas = nullptr;\n      static constexpr ::_pb::Message* const* file_default_instances = nullptr;\n    "
              );
  }
  else {
    local_118[0].
    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_118[0].
    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_118[0].
    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::reserve(local_118,(long)puVar4 - (long)puVar24 >> 3);
    pPVar9 = local_940;
    local_878 = (FileGenerator *)local_868;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_878,"offsets","");
    local_568.heap.control = local_558;
    if (local_878 == (FileGenerator *)local_868) {
      local_558._8_8_ = local_868._8_8_;
    }
    else {
      local_568.heap.control = (ctrl_t *)local_878;
    }
    local_558._1_7_ = local_868._1_7_;
    local_558[0] = local_868[0];
    local_568.heap.slot_array = local_870;
    local_870.p = (FileGenerator *)0x0;
    local_868[0] = 0;
    local_878 = (FileGenerator *)local_868;
    local_558._16_8_ = operator_new(0x20);
    *(FileGenerator **)local_558._16_8_ = this;
    *(vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      **)(local_558._16_8_ + 8) = local_118;
    *(Printer ***)(local_558._16_8_ + 0x10) = &local_940;
    *(ctrl_t *)(local_558._16_8_ + 0x18) = ~kSentinel;
    local_530 = (pointer)std::
                         _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                         ::_M_invoke;
    local_558._24_8_ = (MaybeInitializedPtr)0x0;
    local_538 = (pointer)std::
                         _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                         ::_M_manager;
    local_528 = 1;
    local_520._M_p = (pointer)&local_510;
    local_518 = (pointer)0x0;
    local_510._M_local_buf[0] = '\0';
    local_500 = 0;
    std::__cxx11::string::_M_replace((ulong)&local_520,0,(char *)0x0,0x361ff2);
    local_4f8._M_engaged = false;
    pcVar25 = local_7b0._M_local_buf + 8;
    local_7b8 = pcVar25;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b8,"schemas","");
    local_4b0._0_8_ = local_4b0 + 0x10;
    if (local_7b8 == pcVar25) {
      local_4b0._24_8_ = _Stack_7a0._M_p;
    }
    else {
      local_4b0._0_8_ = local_7b8;
    }
    local_4b0._8_8_ = local_7b0._M_allocated_capacity;
    local_7b0._M_allocated_capacity = 0;
    local_7b0._M_local_buf[8] = '\0';
    local_7b8 = pcVar25;
    local_4b0._32_8_ = operator_new(0x20);
    *(FileGenerator **)local_4b0._32_8_ = this;
    *(Printer ***)(local_4b0._32_8_ + 8) = &local_940;
    *(vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      **)(local_4b0._32_8_ + 0x10) = local_118;
    *(char *)(local_4b0._32_8_ + 0x18) = '\0';
    local_480._8_8_ =
         std::
         _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
         ::_M_invoke;
    local_4b0._40_8_ = 0;
    local_480._0_8_ =
         std::
         _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
         ::_M_manager;
    local_470 = true;
    local_468._M_p = (pointer)&local_458;
    local_460 = 0;
    local_458._M_local_buf[0] = '\0';
    local_448 = false;
    std::__cxx11::string::_M_replace((ulong)&local_468,0,(char *)0x0,0x361ff2);
    local_400 = false;
    google::protobuf::io::Printer::Emit
              (pPVar9,&local_568,2,0x160,
               "\n          const ::uint32_t\n              $tablename$::offsets[] ABSL_ATTRIBUTE_SECTION_VARIABLE(\n                  protodesc_cold) = {\n                  $offsets$,\n          };\n\n          static const ::_pbi::MigrationSchema\n              schemas[] ABSL_ATTRIBUTE_SECTION_VARIABLE(protodesc_cold) = {\n                  $schemas$,\n          };\n        "
              );
    lVar28 = 0x170;
    do {
      if (*(char *)((long)&local_5b0.weak_reflection_files.
                           super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
                           .
                           super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
                           .tree_.size_ + lVar28) == '\x01') {
        std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                  ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                   ((long)&local_5b0.weak_default_instances.
                           super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
                           .
                           super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
                           .tree_.root_ + lVar28));
      }
      if ((long *)(local_5f0.digits_ + lVar28 + 0x18) != *(long **)(local_5f0.digits_ + lVar28 + 8))
      {
        operator_delete(*(long **)(local_5f0.digits_ + lVar28 + 8),
                        *(long *)(local_5f0.digits_ + lVar28 + 0x18) + 1);
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
        ::_S_vtable._M_arr[(byte)local_5f0.digits_[lVar28]]._M_data)
                ((anon_class_1_0_00000001 *)&local_5b0,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                  *)(local_610 + lVar28 + 0x10));
      local_5f0.digits_[lVar28] = -1;
      if ((long *)(local_610 + lVar28) != *(long **)(local_610 + lVar28 + -0x10)) {
        operator_delete(*(long **)(local_610 + lVar28 + -0x10),*(long *)(local_610 + lVar28) + 1);
      }
      lVar28 = lVar28 + -0xb8;
    } while (lVar28 != 0);
    if (local_7b8 != pcVar25) {
      operator_delete(local_7b8,CONCAT71(local_7b0._9_7_,local_7b0._M_local_buf[8]) + 1);
    }
    if (local_878 != (FileGenerator *)local_868) {
      operator_delete(local_878,CONCAT71(local_868._1_7_,local_868[0]) + 1);
    }
    bVar12 = UsingImplicitWeakDescriptor(this->file_,local_938);
    pPVar9 = local_940;
    if (!bVar12) {
      pFVar1 = (FileGenerator *)(local_7d0 + 8);
      local_7d8 = pFVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d8,"defaults","");
      local_568.heap.control = local_558;
      if (local_7d8 == pFVar1) {
        local_558._8_8_ = _Stack_7c0._M_p;
      }
      else {
        local_568.heap.control = (ctrl_t *)local_7d8;
      }
      local_558._1_7_ = local_7d0._9_7_;
      local_558[0] = local_7d0[8];
      local_568.heap.slot_array = (MaybeInitializedPtr)local_7d0._0_8_;
      local_7d0._0_8_ = (FileGenerator *)0x0;
      local_7d0[8] = '\0';
      local_7d8 = pFVar1;
      local_558._16_8_ = operator_new(0x18);
      *(FileGenerator **)local_558._16_8_ = this;
      *(Printer ***)(local_558._16_8_ + 8) = &local_940;
      *(ctrl_t *)(local_558._16_8_ + 0x10) = ~kSentinel;
      local_530 = (pointer)std::
                           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                           ::_M_invoke;
      local_558._24_8_ = (MaybeInitializedPtr)0x0;
      local_538 = (pointer)std::
                           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                           ::_M_manager;
      local_528 = 1;
      local_520._M_p = (pointer)&local_510;
      local_518 = (pointer)0x0;
      local_510._M_local_buf[0] = '\0';
      local_500 = 0;
      std::__cxx11::string::_M_replace((ulong)&local_520,0,(char *)0x0,0x361ff2);
      local_4f8._M_engaged = false;
      google::protobuf::io::Printer::Emit
                (pPVar9,&local_568,1,0x92,
                 "\n                static const ::_pb::Message* const file_default_instances[] = {\n                    $defaults$,\n                };\n              "
                );
      if (local_4f8._M_engaged == true) {
        std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                  (&local_4f8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_520._M_p != &local_510) {
        operator_delete(local_520._M_p,
                        CONCAT71(local_510._M_allocated_capacity._1_7_,local_510._M_local_buf[0]) +
                        1);
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
        ::_S_vtable._M_arr[local_528]._M_data)
                ((anon_class_1_0_00000001 *)&local_5b0,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                  *)(local_558 + 0x10));
      local_528 = 0xff;
      if ((FileGenerator *)local_568.heap.control != (FileGenerator *)local_558) {
        operator_delete(local_568.heap.control,(ulong)(local_558._0_8_ + 1));
      }
      if (local_7d8 != pFVar1) {
        operator_delete(local_7d8,CONCAT71(local_7d0._9_7_,local_7d0[8]) + 1);
      }
    }
    if (local_118[0].
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_118[0].
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_118[0].
                            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_118[0].
                            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  StripSourceRetentionOptions((compiler *)local_118,this->file_,false);
  local_7f8 = local_7f0._M_local_buf + 8;
  local_7f0._M_allocated_capacity = 0;
  local_7f0._M_local_buf[8] = '\0';
  google::protobuf::MessageLite::SerializeToString((string *)local_118);
  name._M_str = (char *)(*(size_t **)(this->file_ + 8))[1];
  name._M_len = (size_t)"descriptor_table_protodef";
  filename._M_str = (char *)local_938;
  filename._M_len = **(size_t **)(this->file_ + 8);
  UniqueName_abi_cxx11_(&local_650,(cpp *)0x19,name,filename,in_stack_fffffffffffff6a8);
  pPVar9 = local_940;
  local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6d8,"desc_name","");
  io::Printer::Sub::Sub<std::__cxx11::string&>((Sub *)&local_568.heap,&local_6d8,&local_650);
  local_818 = &local_808;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_818,"encoded_file_proto","");
  local_4b0._0_8_ = local_4b0 + 0x10;
  if (local_818 == &local_808) {
    local_4b0._24_8_ = local_808.remote.size;
  }
  else {
    local_4b0._0_8_ = local_818;
  }
  local_4b0._8_8_ = local_810;
  local_810 = (AccessInfoMap *)0x0;
  local_808.storage[0] = '\0';
  local_818 = &local_808;
  local_4b0._32_8_ = operator_new(0x20);
  *(FileGenerator **)local_4b0._32_8_ = this;
  *(Printer ***)(local_4b0._32_8_ + 8) = &local_940;
  *(char ***)(local_4b0._32_8_ + 0x10) = &local_7f8;
  *(char *)(local_4b0._32_8_ + 0x18) = '\0';
  local_480._8_8_ =
       std::
       _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
       ::_M_invoke;
  local_4b0._40_8_ = 0;
  local_480._0_8_ =
       std::
       _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
       ::_M_manager;
  local_470 = true;
  local_468._M_p = (pointer)&local_458;
  local_460 = 0;
  local_458._M_local_buf[0] = '\0';
  local_448 = false;
  std::__cxx11::string::_M_replace((ulong)&local_468,0,(char *)0x0,0x361ff2);
  local_400 = false;
  google::protobuf::io::Printer::Emit
            (pPVar9,&local_568,2,0x96,
             "\n        const char $desc_name$[] ABSL_ATTRIBUTE_SECTION_VARIABLE(\n            protodesc_cold) = {\n            $encoded_file_proto$,\n        };\n      "
            );
  lVar28 = 0x170;
  do {
    if (*(char *)((long)&local_5b0.weak_reflection_files.
                         super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
                         .
                         super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
                         .tree_.size_ + lVar28) == '\x01') {
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                 ((long)&local_5b0.weak_default_instances.
                         super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
                         .
                         super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
                         .tree_.root_ + lVar28));
    }
    if ((long *)(local_5f0.digits_ + lVar28 + 0x18) != *(long **)(local_5f0.digits_ + lVar28 + 8)) {
      operator_delete(*(long **)(local_5f0.digits_ + lVar28 + 8),
                      *(long *)(local_5f0.digits_ + lVar28 + 0x18) + 1);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[(byte)local_5f0.digits_[lVar28]]._M_data)
              ((anon_class_1_0_00000001 *)&local_5b0,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)(local_610 + lVar28 + 0x10));
    local_5f0.digits_[lVar28] = -1;
    if ((long *)(local_610 + lVar28) != *(long **)(local_610 + lVar28 + -0x10)) {
      operator_delete(*(long **)(local_610 + lVar28 + -0x10),*(long *)(local_610 + lVar28) + 1);
    }
    lVar28 = lVar28 + -0xb8;
  } while (lVar28 != 0);
  if (local_818 != &local_808) {
    operator_delete(local_818,CONCAT71(local_808._1_7_,local_808.storage[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
    operator_delete(local_6d8._M_dataplus._M_p,local_6d8.field_2._M_allocated_capacity + 1);
  }
  local_5b0.weak_default_instances.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .tree_.root_ = (node_type *)
                 absl::lts_20240722::container_internal::
                 btree<absl::lts_20240722::container_internal::set_params<google::protobuf::Descriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::Descriptor_const*>,256,false>>
                 ::EmptyNode()::empty_node;
  local_5b0.weak_default_instances.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .tree_.rightmost_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::Descriptor_*>::checked_compare,_std::allocator<const_google::protobuf::Descriptor_*>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
  .
  super_Storage<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_*,_2UL,_false>
  .value = (CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::Descriptor_*>::checked_compare,_std::allocator<const_google::protobuf::Descriptor_*>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
            )absl::lts_20240722::container_internal::
             btree<absl::lts_20240722::container_internal::set_params<google::protobuf::Descriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::Descriptor_const*>,256,false>>
             ::EmptyNode()::empty_node;
  local_5b0.weak_default_instances.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .tree_.size_ = 0;
  local_5b0.strong_reflection_files.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .tree_.root_ = (node_type *)
                 absl::lts_20240722::container_internal::
                 btree<absl::lts_20240722::container_internal::set_params<google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::FileDescriptor_const*>,256,false>>
                 ::EmptyNode()::empty_node;
  local_5b0.strong_reflection_files.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .tree_.rightmost_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::FileDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
  .
  super_Storage<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*,_2UL,_false>
  .value = (CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::FileDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
            )absl::lts_20240722::container_internal::
             btree<absl::lts_20240722::container_internal::set_params<google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::FileDescriptor_const*>,256,false>>
             ::EmptyNode()::empty_node;
  local_5b0.strong_reflection_files.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .tree_.size_ = 0;
  local_5b0.weak_reflection_files.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .tree_.root_ = (node_type *)
                 absl::lts_20240722::container_internal::
                 btree<absl::lts_20240722::container_internal::set_params<google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::FileDescriptor_const*>,256,false>>
                 ::EmptyNode()::empty_node;
  local_5b0.weak_reflection_files.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .tree_.rightmost_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::FileDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
  .
  super_Storage<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*,_2UL,_false>
  .value = (CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::FileDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
            )absl::lts_20240722::container_internal::
             btree<absl::lts_20240722::container_internal::set_params<google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::FileDescriptor_const*>,256,false>>
             ::EmptyNode()::empty_node;
  local_5b0.weak_reflection_files.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .tree_.size_ = 0;
  GetCrossFileReferencesForFile(this,this->file_,&local_5b0);
  pPVar9 = local_940;
  local_8a0 = (long)&(((__uniq_ptr_data<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>,_true,_true>
                        *)local_5b0.weak_reflection_files.
                          super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
                          .
                          super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
                          .tree_.size_)->
                     super___uniq_ptr_impl<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>
                     )._M_t.
                     super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>
                     .
                     super__Head_base<0UL,_google::protobuf::compiler::cpp::ExtensionGenerator_*,_false>
                     ._M_head_impl +
              local_5b0.strong_reflection_files.
              super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
              .
              super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
              .tree_.size_;
  if (local_8a0 != 0) {
    local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f8,"len","");
    io::Printer::Sub::Sub<unsigned_long&>((Sub *)&local_568.heap,&local_6f8,&local_8a0);
    local_838 = &local_828;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_838,"deps","");
    local_4b0._0_8_ = local_4b0 + 0x10;
    if (local_838 == &local_828) {
      local_4b0._24_8_ = local_828.remote.size;
    }
    else {
      local_4b0._0_8_ = local_838;
    }
    local_4b0._8_8_ = local_830;
    local_830 = (AccessInfoMap *)0x0;
    local_828.storage[0] = '\0';
    local_838 = &local_828;
    local_4b0._32_8_ = operator_new(0x20);
    *(CrossFileReferences **)local_4b0._32_8_ = &local_5b0;
    *(Printer ***)(local_4b0._32_8_ + 8) = &local_940;
    *(FileGenerator **)(local_4b0._32_8_ + 0x10) = this;
    *(char *)(local_4b0._32_8_ + 0x18) = '\0';
    local_480._8_8_ =
         std::
         _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
         ::_M_invoke;
    local_4b0._40_8_ = 0;
    local_480._0_8_ =
         std::
         _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
         ::_M_manager;
    local_470 = true;
    local_468._M_p = (pointer)&local_458;
    local_460 = 0;
    local_458._M_local_buf[0] = '\0';
    local_448 = false;
    std::__cxx11::string::_M_replace((ulong)&local_468,0,(char *)0x0,0x361ff2);
    local_400 = false;
    google::protobuf::io::Printer::Emit
              (pPVar9,&local_568,2,0x91,
               "\n          static const ::_pbi::DescriptorTable* const $desc_table$_deps[$len$] =\n              {\n                  $deps$,\n          };\n        "
              );
    lVar28 = 0x170;
    do {
      if (*(char *)((long)&local_5b0.weak_reflection_files.
                           super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
                           .
                           super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
                           .tree_.size_ + lVar28) == '\x01') {
        std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                  ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                   ((long)&local_5b0.weak_default_instances.
                           super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
                           .
                           super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
                           .tree_.root_ + lVar28));
      }
      if ((long *)(local_5f0.digits_ + lVar28 + 0x18) != *(long **)(local_5f0.digits_ + lVar28 + 8))
      {
        operator_delete(*(long **)(local_5f0.digits_ + lVar28 + 8),
                        *(long *)(local_5f0.digits_ + lVar28 + 0x18) + 1);
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
        ::_S_vtable._M_arr[(byte)local_5f0.digits_[lVar28]]._M_data)
                ((anon_class_1_0_00000001 *)&local_5f0,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                  *)(local_610 + lVar28 + 0x10));
      local_5f0.digits_[lVar28] = -1;
      if ((long *)(local_610 + lVar28) != *(long **)(local_610 + lVar28 + -0x10)) {
        operator_delete(*(long **)(local_610 + lVar28 + -0x10),*(long *)(local_610 + lVar28) + 1);
      }
      lVar28 = lVar28 + -0xb8;
    } while (lVar28 != 0);
    if (local_838 != &local_828) {
      operator_delete(local_838,CONCAT71(local_828._1_7_,local_828.storage[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
      operator_delete(local_6f8._M_dataplus._M_p,(ulong)(local_6f8.field_2._0_8_ + 1));
    }
  }
  pPVar9 = local_940;
  local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_670,"eager","");
  local_928._M_dataplus._M_p = "false";
  io::Printer::Sub::Sub<char_const*>((Sub *)&local_568.heap,&local_670,(char **)&local_928);
  local_718._M_dataplus._M_p = (pointer)&local_718.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_718,"file_proto_len","");
  local_898._M_dataplus._M_p = (pointer)local_7f0._M_allocated_capacity;
  if ((this->options_).strip_nonfunctional_codegen != false) {
    local_898._M_dataplus._M_p =
         (pointer)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
  }
  io::Printer::Sub::Sub<unsigned_long>((Sub *)local_4b0,&local_718,(unsigned_long *)&local_898);
  local_738._M_dataplus._M_p = (pointer)&local_738.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_738,"proto_name","");
  io::Printer::Sub::Sub<std::__cxx11::string&>(&local_3f8,&local_738,&local_650);
  local_690.heap.control = (ctrl_t *)&local_680;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_690,"deps_ptr","");
  if (local_8a0 == 0) {
    local_900._0_8_ = local_900 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_900,"nullptr","");
  }
  else {
    local_5f0.piece_ =
         (string_view)google::protobuf::io::Printer::LookupVar(local_940,10,"desc_table");
    local_8d8.piece_._M_len = (size_t)&DAT_00000005;
    local_8d8.piece_._M_str = "_deps";
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_900,&local_5f0);
  }
  io::Printer::Sub::Sub<std::__cxx11::string>
            (&local_340,(string *)&local_690.heap,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_900);
  local_758._M_dataplus._M_p = (pointer)&local_758.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_758,"num_deps","");
  io::Printer::Sub::Sub<unsigned_long&>(&local_288,&local_758,&local_8a0);
  local_6b0._M_dataplus._M_p = (pointer)&local_6b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b0,"num_msgs","");
  local_858.heap.control =
       (ctrl_t *)
       ((long)(this->message_generators_).
              super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->message_generators_).
              super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3);
  io::Printer::Sub::Sub<unsigned_long>(&local_1d0,&local_6b0,(unsigned_long *)(local_868 + 0x10));
  google::protobuf::io::Printer::Emit
            (pPVar9,&local_568,6,0x226,
             "\n        static ::absl::once_flag $desc_table$_once;\n        PROTOBUF_CONSTINIT const ::_pbi::DescriptorTable $desc_table$ = {\n            false,\n            $eager$,\n            $file_proto_len$,\n            $proto_name$,\n            \"$filename$\",\n            &$desc_table$_once,\n            $deps_ptr$,\n            $num_deps$,\n            $num_msgs$,\n            schemas,\n            file_default_instances,\n            $tablename$::offsets,\n            $file_level_enum_descriptors$,\n            $file_level_service_descriptors$,\n        };\n      "
            );
  lVar28 = 0x450;
  do {
    if (*(char *)((long)&local_5b0.weak_reflection_files.
                         super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
                         .
                         super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
                         .tree_.size_ + lVar28) == '\x01') {
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                 ((long)&local_5b0.weak_default_instances.
                         super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
                         .
                         super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
                         .tree_.root_ + lVar28));
    }
    if ((long *)(local_5f0.digits_ + lVar28 + 0x18) != *(long **)(local_5f0.digits_ + lVar28 + 8)) {
      operator_delete(*(long **)(local_5f0.digits_ + lVar28 + 8),
                      *(long *)(local_5f0.digits_ + lVar28 + 0x18) + 1);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[(byte)local_5f0.digits_[lVar28]]._M_data)
              (&local_929,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)(local_610 + lVar28 + 0x10));
    local_5f0.digits_[lVar28] = -1;
    if ((long *)(local_610 + lVar28) != *(long **)(local_610 + lVar28 + -0x10)) {
      operator_delete(*(long **)(local_610 + lVar28 + -0x10),*(long *)(local_610 + lVar28) + 1);
    }
    lVar28 = lVar28 + -0xb8;
  } while (lVar28 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b0._M_dataplus._M_p != &local_6b0.field_2) {
    operator_delete(local_6b0._M_dataplus._M_p,local_6b0.field_2._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_758._M_dataplus._M_p != &local_758.field_2) {
    operator_delete(local_758._M_dataplus._M_p,local_758.field_2._0_8_ + 1);
  }
  if ((Printer *)local_900._0_8_ != (Printer *)(local_900 + 0x10)) {
    operator_delete((void *)local_900._0_8_,local_900._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_690.heap.control != &local_680) {
    operator_delete(local_690.heap.control,local_680._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_738._M_dataplus._M_p != &local_738.field_2) {
    operator_delete(local_738._M_dataplus._M_p,local_738.field_2._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_718._M_dataplus._M_p != &local_718.field_2) {
    operator_delete(local_718._M_dataplus._M_p,local_718.field_2._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_670._M_dataplus._M_p != &local_670.field_2) {
    operator_delete(local_670._M_dataplus._M_p,local_670.field_2._0_8_ + 1);
  }
  cVar13 = google::protobuf::internal::cpp::IsLazilyInitializedFile
                     ((*(undefined8 **)(this->file_ + 8))[1],**(undefined8 **)(this->file_ + 8));
  if (cVar13 == '\0') {
    bVar12 = UsingImplicitWeakDescriptor(this->file_,local_938);
    if (bVar12) {
      _Var23._M_p = (pointer)this->file_;
      local_900._0_8_ =
           absl::lts_20240722::container_internal::
           btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>
           ::EmptyNode()::empty_node;
      local_900._8_8_ =
           absl::lts_20240722::container_internal::
           btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>
           ::EmptyNode()::empty_node;
      local_900._16_8_ = 0;
      iVar29 = *(int *)((FileDescriptor *)_Var23._M_p + 0x44);
      if (0 < iVar29) {
        lVar28 = 0;
        local_6b8._M_p = _Var23._M_p;
        do {
          lVar5 = *(long *)((FileDescriptor *)_Var23._M_p + 0x70);
          if (0 < *(int *)(lVar5 + 0x38 + lVar28 * 0x40)) {
            lVar27 = 0;
            do {
              pDVar16 = (mapped_type)google::protobuf::MethodDescriptor::input_type();
              lVar17 = google::protobuf::MethodDescriptor::input_type();
              ppDVar18 = absl::lts_20240722::container_internal::
                         btree_map_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                         ::operator[]<std::__cxx11::string>
                                   ((btree_map_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                                     *)local_900,
                                    (key_arg<std::__cxx11::basic_string<char>_> *)
                                    (*(long *)(lVar17 + 8) + 0x20));
              *ppDVar18 = pDVar16;
              pDVar16 = (mapped_type)google::protobuf::MethodDescriptor::output_type();
              lVar17 = google::protobuf::MethodDescriptor::output_type();
              ppDVar18 = absl::lts_20240722::container_internal::
                         btree_map_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                         ::operator[]<std::__cxx11::string>
                                   ((btree_map_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                                     *)local_900,
                                    (key_arg<std::__cxx11::basic_string<char>_> *)
                                    (*(long *)(lVar17 + 8) + 0x20));
              *ppDVar18 = pDVar16;
              lVar27 = lVar27 + 1;
            } while (lVar27 < *(int *)(lVar5 + lVar28 * 0x40 + 0x38));
            iVar29 = *(int *)(local_6b8._M_p + 0x44);
            _Var23._M_p = local_6b8._M_p;
          }
          lVar28 = lVar28 + 1;
        } while (lVar28 < iVar29);
      }
      pDVar6 = *(DescriptorPool **)((FileDescriptorProto *)_Var23._M_p + 0x18);
      lVar28 = google::protobuf::FileDescriptorProto::GetMetadata();
      lVar28 = google::protobuf::DescriptorPool::FindMessageTypeByName
                         (pDVar6,*(undefined8 *)(*(long *)(lVar28 + 8) + 0x28),
                          *(undefined8 *)(*(long *)(lVar28 + 8) + 0x20));
      if (lVar28 != 0) {
        google::protobuf::DynamicMessageFactory::DynamicMessageFactory
                  ((DynamicMessageFactory *)&local_5f0,pDVar6);
        pAVar19 = (Arena *)google::protobuf::DynamicMessageFactory::GetPrototype
                                     ((Descriptor *)&local_5f0);
        local_908 = (long *)google::protobuf::MessageLite::New(pAVar19);
        google::protobuf::FileDescriptorProto::FileDescriptorProto
                  ((FileDescriptorProto *)&local_568.heap,(Arena *)0x0);
        google::protobuf::FileDescriptor::CopyTo((FileDescriptorProto *)_Var23._M_p);
        google::protobuf::MessageLite::SerializeAsString_abi_cxx11_();
        cVar13 = google::protobuf::MessageLite::ParseFromString
                           (local_908,local_8d8.piece_._M_str,local_8d8.piece_._M_len);
        if (cVar13 == '\0') {
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_898,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/compiler/cpp/file.cc"
                     ,0x42e,0x40,"fd_proto->ParseFromString(linkedin_fd_proto.SerializeAsString())")
          ;
LAB_001c163f:
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_898);
        }
        if ((char *)local_8d8.piece_._M_len != local_8d8.digits_) {
          operator_delete((void *)local_8d8.piece_._M_len,local_8d8.digits_._0_8_ + 1);
        }
        google::protobuf::FileDescriptorProto::~FileDescriptorProto
                  ((FileDescriptorProto *)&local_568.heap);
        local_8d8.piece_._M_len = (size_t)local_908;
        __l._M_len = 1;
        __l._M_array = (iterator)&local_8d8;
        std::
        vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
        ::vector((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                  *)&local_568.heap,__l,(allocator_type *)&local_898);
        if ((MaybeInitializedPtr)local_568.heap.control != local_568.heap.slot_array.p) {
          do {
            pvVar7 = *(vector **)((long)local_568.heap.slot_array + -8);
            local_568.heap.slot_array = (MaybeInitializedPtr)((long)local_568.heap.slot_array + -8);
            local_8d8.piece_._M_len = 0;
            local_8d8.piece_._M_str = (char *)0x0;
            local_8d8.digits_[0] = '\0';
            local_8d8.digits_[1] = '\0';
            local_8d8.digits_[2] = '\0';
            local_8d8.digits_[3] = '\0';
            local_8d8.digits_[4] = '\0';
            local_8d8.digits_[5] = '\0';
            local_8d8.digits_[6] = '\0';
            local_8d8.digits_[7] = '\0';
            google::protobuf::Message::GetMetadata();
            google::protobuf::Reflection::ListFields(extraout_RDX,pvVar7);
            pcVar25 = local_8d8.piece_._M_str;
            for (plVar22 = (long *)local_8d8.piece_._M_len; plVar22 != (long *)pcVar25;
                plVar22 = plVar22 + 1) {
              pMVar8 = (MessageFactory *)*plVar22;
              if (((byte)pMVar8[1] & 8) != 0) {
                pDVar16 = (mapped_type)google::protobuf::Message::GetMetadata();
                ppDVar18 = absl::lts_20240722::container_internal::
                           btree_map_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                           ::operator[]<std::__cxx11::string>
                                     ((btree_map_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                                       *)local_900,
                                      (key_arg<std::__cxx11::basic_string<char>_> *)
                                      (*(long *)(pDVar16 + 8) + 0x20));
                *ppDVar18 = pDVar16;
              }
              pDVar16 = (mapped_type)google::protobuf::FieldDescriptor::message_type();
              if (pDVar16 != (mapped_type)0x0) {
                MVar2 = pMVar8[1];
                if (((byte)MVar2 & 8) != 0) {
                  ppDVar18 = absl::lts_20240722::container_internal::
                             btree_map_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                             ::operator[]<std::__cxx11::string>
                                       ((btree_map_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                                         *)local_900,
                                        (key_arg<std::__cxx11::basic_string<char>_> *)
                                        (*(long *)(pDVar16 + 8) + 0x20));
                  *ppDVar18 = pDVar16;
                  MVar2 = pMVar8[1];
                }
                bVar12 = (bool)(((byte)MVar2 & 0x20) >> 5);
                if (0xbf < (byte)MVar2 != bVar12) {
                  psVar21 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                                      (bVar12,0xbf < (byte)MVar2,
                                       "is_repeated_ == label() == LABEL_REPEATED");
                  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                            ((LogMessageFatal *)&local_898,
                             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                             ,0xab7,*(undefined8 *)(psVar21 + 8),*(undefined8 *)psVar21);
                  goto LAB_001c163f;
                }
                if (((byte)MVar2 & 0x20) == 0) {
                  local_898._M_dataplus._M_p =
                       (pointer)google::protobuf::Reflection::GetMessage
                                          (extraout_RDX,(FieldDescriptor *)pvVar7,pMVar8);
                  std::
                  vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
                  ::emplace_back<google::protobuf::Message_const*>
                            ((vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
                              *)&local_568.heap,(Message **)&local_898);
                }
                else {
                  iVar29 = 0;
                  while( true ) {
                    iVar15 = google::protobuf::Reflection::FieldSize
                                       (extraout_RDX,(FieldDescriptor *)pvVar7);
                    if (iVar15 <= iVar29) break;
                    local_898._M_dataplus._M_p =
                         (pointer)google::protobuf::Reflection::GetRepeatedMessage
                                            (extraout_RDX,(FieldDescriptor *)pvVar7,(int)pMVar8);
                    std::
                    vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
                    ::emplace_back<google::protobuf::Message_const*>
                              ((vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
                                *)&local_568.heap,(Message **)&local_898);
                    iVar29 = iVar29 + 1;
                  }
                }
              }
            }
            if ((long *)local_8d8.piece_._M_len != (long *)0x0) {
              operator_delete((void *)local_8d8.piece_._M_len,
                              local_8d8.digits_._0_8_ - local_8d8.piece_._M_len);
            }
          } while ((MaybeInitializedPtr)local_568.heap.control != local_568.heap.slot_array.p);
        }
        if ((FileGenerator *)local_568.heap.control != (FileGenerator *)0x0) {
          operator_delete(local_568.heap.control,local_558._0_8_ - local_568._0_8_);
        }
        (**(code **)(*local_908 + 8))();
        google::protobuf::DynamicMessageFactory::~DynamicMessageFactory
                  ((DynamicMessageFactory *)&local_5f0);
      }
      local_928._M_dataplus._M_p = (pointer)0x0;
      local_928._M_string_length = 0;
      local_928.field_2._M_allocated_capacity = 0;
      iVar30 = absl::lts_20240722::container_internal::
               btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
               ::begin((btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
                        *)local_900);
      uVar11 = local_900._8_8_;
      local_568.heap.control = (ctrl_t *)iVar30.node_;
      local_568._8_4_ = iVar30.position_;
      if ((local_900._8_8_ & 7) != 0) {
        __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/layout.h"
                      ,0x1fe,
                      "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string_view<char>, const google::protobuf::Descriptor *, std::less<std::basic_string_view<char>>, std::allocator<std::pair<const std::basic_string_view<char>, const google::protobuf::Descriptor *>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<std::basic_string_view<char>, const google::protobuf::Descriptor *>, absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string_view<char>, const google::protobuf::Descriptor *, std::less<std::basic_string_view<char>>, std::allocator<std::pair<const std::basic_string_view<char>, const google::protobuf::Descriptor *>>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 10, 11>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string_view<char>, const google::protobuf::Descriptor *, std::less<std::basic_string_view<char>>, std::allocator<std::pair<const std::basic_string_view<char>, const google::protobuf::Descriptor *>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<std::basic_string_view<char>, const google::protobuf::Descriptor *>, absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string_view<char>, const google::protobuf::Descriptor *, std::less<std::basic_string_view<char>>, std::allocator<std::pair<const std::basic_string_view<char>, const google::protobuf::Descriptor *>>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 10, 11>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = std::integer_sequence<unsi..." /* TRUNCATED STRING LITERAL */
                     );
      }
      bVar3 = *(btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
                *)(local_900._8_8_ + 10);
      while( true ) {
        other.position_._0_1_ = bVar3;
        other.node_ = (btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
                       *)uVar11;
        other._9_7_ = 0;
        bVar12 = absl::lts_20240722::container_internal::
                 btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_&,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_*>
                 ::Equals((btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_&,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_*>
                           *)&local_568.heap,other);
        if (bVar12) break;
        ppVar20 = absl::lts_20240722::container_internal::
                  btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_&,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_*>
                  ::operator*((btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_&,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_*>
                               *)&local_568.heap);
        bVar12 = IsBootstrapProto(local_938,*(FileDescriptor **)(ppVar20->second + 0x10));
        if (!bVar12) {
          if (local_928._M_string_length == local_928.field_2._M_allocated_capacity) {
            std::
            vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
            ::_M_realloc_insert<google::protobuf::Descriptor_const*const&>
                      ((vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
                        *)&local_928,(iterator)local_928._M_string_length,&ppVar20->second);
          }
          else {
            *(Descriptor **)local_928._M_string_length = ppVar20->second;
            local_928._M_string_length = local_928._M_string_length + 8;
          }
        }
        absl::lts_20240722::container_internal::
        btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_&,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_*>
        ::increment((btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_&,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_*>
                     *)&local_568.heap);
      }
      absl::lts_20240722::container_internal::
      btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
      ::~btree((btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
                *)local_900);
      sVar10 = local_928._M_string_length;
      if (local_928._M_dataplus._M_p != (pointer)local_928._M_string_length) {
        _Var23._M_p = local_928._M_dataplus._M_p;
        do {
          local_568.heap.slot_array = (MaybeInitializedPtr)*(undefined8 *)_Var23._M_p;
          local_558._8_8_ =
               absl::lts_20240722::internal_any_invocable::
               LocalInvoker<false,void,google::protobuf::compiler::cpp::FileGenerator::GenerateReflectionInitializationCode(google::protobuf::io::Printer*)::__0&,google::protobuf::io::Printer*>
          ;
          local_558._0_8_ = absl::lts_20240722::internal_any_invocable::LocalManagerTrivial;
          local_568.heap.control = (ctrl_t *)this;
          std::
          vector<absl::lts_20240722::AnyInvocable<void(google::protobuf::io::Printer*)>,std::allocator<absl::lts_20240722::AnyInvocable<void(google::protobuf::io::Printer*)>>>
          ::emplace_back<absl::lts_20240722::AnyInvocable<void(google::protobuf::io::Printer*)>>
                    ((vector<absl::lts_20240722::AnyInvocable<void(google::protobuf::io::Printer*)>,std::allocator<absl::lts_20240722::AnyInvocable<void(google::protobuf::io::Printer*)>>>
                      *)(this->static_initializers_ + 1),
                     (AnyInvocable<void_(google::protobuf::io::Printer_*)> *)&local_568.heap);
          (*(code *)local_558._0_8_)(1,&local_568,&local_568);
          _Var23._M_p = _Var23._M_p + 8;
        } while (_Var23._M_p != (pointer)sVar10);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_928._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_928._M_dataplus._M_p,
                        local_928.field_2._M_allocated_capacity - (long)local_928._M_dataplus._M_p);
      }
    }
    local_558._8_8_ =
         absl::lts_20240722::internal_any_invocable::
         LocalInvoker<false,void,google::protobuf::compiler::cpp::FileGenerator::GenerateReflectionInitializationCode(google::protobuf::io::Printer*)::__1&,google::protobuf::io::Printer*>
    ;
    local_558._0_8_ = absl::lts_20240722::internal_any_invocable::LocalManagerTrivial;
    std::
    vector<absl::lts_20240722::AnyInvocable<void(google::protobuf::io::Printer*)>,std::allocator<absl::lts_20240722::AnyInvocable<void(google::protobuf::io::Printer*)>>>
    ::emplace_back<absl::lts_20240722::AnyInvocable<void(google::protobuf::io::Printer*)>>
              ((vector<absl::lts_20240722::AnyInvocable<void(google::protobuf::io::Printer*)>,std::allocator<absl::lts_20240722::AnyInvocable<void(google::protobuf::io::Printer*)>>>
                *)(this->static_initializers_ + 1),
               (AnyInvocable<void_(google::protobuf::io::Printer_*)> *)&local_568.heap);
    (*(code *)local_558._0_8_)(1,&local_568);
  }
  bVar12 = IsFileDescriptorProto(this->file_,local_938);
  if (bVar12) {
    local_900._0_8_ = local_940;
    local_900._16_8_ = 0;
    local_900[0x18] = '\0';
    local_900[0x19] = '\0';
    local_900[0x1a] = '\0';
    local_900[0x1b] = '\0';
    local_900[0x1c] = '\0';
    local_900[0x1d] = '\0';
    local_900[0x1e] = '\0';
    local_900[0x1f] = '\0';
    local_8e0 = (pointer)0x0;
    bVar12 = (this->options_).opensource_runtime != false;
    local_568.heap.control = (ctrl_t *)(FileGenerator *)0x6;
    if (bVar12) {
      local_568.heap.control = (ctrl_t *)(FileGenerator *)0x10;
    }
    local_568.heap.slot_array = (MaybeInitializedPtr)"proto2";
    if (bVar12) {
      local_568.heap.slot_array = (MaybeInitializedPtr)"google::protobuf";
    }
    local_5f0.piece_._M_len = 10;
    local_5f0.piece_._M_str = "::internal";
    absl::lts_20240722::StrCat_abi_cxx11_(&local_8d8,(AlphaNum *)&local_568.heap);
    NamespaceOpener::ChangeTo
              ((NamespaceOpener *)local_900,local_8d8.piece_._M_str,local_8d8.piece_._M_len);
    if ((char *)local_8d8.piece_._M_len != local_8d8.digits_) {
      operator_delete((void *)local_8d8.piece_._M_len,local_8d8.digits_._0_8_ + 1);
    }
    pPVar9 = local_940;
    local_778._M_dataplus._M_p = (pointer)&local_778.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_778,"dummy","");
    sVar26 = **(size_t **)(this->file_ + 8);
    name_00._M_str = (char *)(*(size_t **)(this->file_ + 8))[1];
    name_00._M_len = (size_t)"dynamic_init_dummy";
    filename_00._M_str = (char *)local_938;
    filename_00._M_len = sVar26;
    UniqueName_abi_cxx11_(&local_898,(cpp *)0x12,name_00,filename_00,in_stack_fffffffffffff6a8);
    io::Printer::Sub::Sub<std::__cxx11::string>((Sub *)&local_568.heap,&local_778,&local_898);
    local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_798,"initializers","");
    puVar24 = (this->message_generators_).
              super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar4 = (this->message_generators_).
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_858.heap.control = local_868 + 0x20;
    local_858.heap.slot_array.p = (MaybeInitializedPtr)0x0;
    local_848 = 0;
    if (puVar24 != puVar4) {
      pcVar25 = "";
      do {
        std::__cxx11::string::append((char *)(local_868 + 0x10),(ulong)pcVar25);
        DefaultInstanceName_abi_cxx11_
                  (&local_928,
                   (cpp *)((puVar24->_M_t).
                           super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                           .
                           super__Head_base<0UL,_google::protobuf::compiler::cpp::MessageGenerator_*,_false>
                          ._M_head_impl)->descriptor_,(Descriptor *)local_938,(Options *)0x0,
                   SUB81(sVar26,0));
        local_5f0.piece_._M_len = local_928._M_string_length;
        local_5f0.piece_._M_str = local_928._M_dataplus._M_p;
        local_8d8.piece_._M_len = (size_t)&DAT_00000008;
        local_8d8.piece_._M_str = ".Init();";
        absl::lts_20240722::StrAppend((string *)(local_868 + 0x10),&local_5f0,&local_8d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_928._M_dataplus._M_p != &local_928.field_2) {
          operator_delete(local_928._M_dataplus._M_p,local_928.field_2._M_allocated_capacity + 1);
        }
        puVar24 = puVar24 + 1;
        pcVar25 = "\n";
      } while (puVar24 != puVar4);
    }
    io::Printer::Sub::Sub<std::__cxx11::string>
              ((Sub *)local_4b0,&local_798,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_868 + 0x10));
    google::protobuf::io::Printer::Emit
              (pPVar9,&local_568,2,0x1dc,
               "\n          //~ Emit wants an indented line, so give it a comment to strip.\n#if !defined(PROTOBUF_CONSTINIT_DEFAULT_INSTANCES)\n          PROTOBUF_EXPORT void InitializeFileDescriptorDefaultInstancesSlow() {\n            $initializers$;\n          }\n          PROTOBUF_ATTRIBUTE_INIT_PRIORITY1\n          static std::true_type $dummy${\n              (InitializeFileDescriptorDefaultInstances(), std::true_type{})};\n#endif  // !defined(PROTOBUF_CONSTINIT_DEFAULT_INSTANCES)\n        "
              );
    lVar28 = 0x170;
    do {
      if (*(char *)((long)&local_5b0.weak_reflection_files.
                           super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
                           .
                           super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
                           .tree_.size_ + lVar28) == '\x01') {
        std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                  ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                   ((long)&local_5b0.weak_default_instances.
                           super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
                           .
                           super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
                           .tree_.root_ + lVar28));
      }
      if ((long *)(local_5f0.digits_ + lVar28 + 0x18) != *(long **)(local_5f0.digits_ + lVar28 + 8))
      {
        operator_delete(*(long **)(local_5f0.digits_ + lVar28 + 8),
                        *(long *)(local_5f0.digits_ + lVar28 + 0x18) + 1);
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
        ::_S_vtable._M_arr[(byte)local_5f0.digits_[lVar28]]._M_data)
                ((anon_class_1_0_00000001 *)&local_5f0,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                  *)(local_610 + lVar28 + 0x10));
      local_5f0.digits_[lVar28] = -1;
      if ((long *)(local_610 + lVar28) != *(long **)(local_610 + lVar28 + -0x10)) {
        operator_delete(*(long **)(local_610 + lVar28 + -0x10),*(long *)(local_610 + lVar28) + 1);
      }
      lVar28 = lVar28 + -0xb8;
    } while (lVar28 != 0);
    if (local_858.heap.control != local_868 + 0x20) {
      operator_delete(local_858.heap.control,CONCAT71(uStack_847,local_848) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_798._M_dataplus._M_p != &local_798.field_2) {
      operator_delete(local_798._M_dataplus._M_p,local_798.field_2._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_898._M_dataplus._M_p != &local_898.field_2) {
      operator_delete(local_898._M_dataplus._M_p,local_898.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_778._M_dataplus._M_p != &local_778.field_2) {
      operator_delete(local_778._M_dataplus._M_p,
                      (ulong)(local_778.field_2._M_allocated_capacity + 1));
    }
    NamespaceOpener::~NamespaceOpener((NamespaceOpener *)local_900);
  }
  absl::lts_20240722::container_internal::
  btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
  ::~btree((btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
            *)&local_5b0.weak_reflection_files);
  absl::lts_20240722::container_internal::
  btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
  ::~btree((btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
            *)&local_5b0.strong_reflection_files);
  absl::lts_20240722::container_internal::
  btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>
  ::~btree((btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>
            *)&local_5b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_650._M_dataplus._M_p != &local_650.field_2) {
    operator_delete(local_650._M_dataplus._M_p,(ulong)(local_650.field_2._M_allocated_capacity + 1))
    ;
  }
  if (local_7f8 != local_7f0._M_local_buf + 8) {
    operator_delete(local_7f8,CONCAT71(local_7f0._9_7_,local_7f0._M_local_buf[8]) + 1);
  }
  google::protobuf::FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_118);
  return;
}

Assistant:

void FileGenerator::GenerateReflectionInitializationCode(io::Printer* p) {
  if (!enum_generators_.empty()) {
    p->Emit({{"len", enum_generators_.size()}}, R"cc(
      static const ::_pb::EnumDescriptor* $file_level_enum_descriptors$[$len$];
    )cc");
  } else {
    p->Emit(R"cc(
      static constexpr const ::_pb::EnumDescriptor**
          $file_level_enum_descriptors$ = nullptr;
    )cc");
  }

  if (HasGenericServices(file_, options_) && file_->service_count() > 0) {
    p->Emit({{"len", file_->service_count()}}, R"cc(
      static const ::_pb::ServiceDescriptor*
          $file_level_service_descriptors$[$len$];
    )cc");
  } else {
    p->Emit(R"cc(
      static constexpr const ::_pb::ServiceDescriptor**
          $file_level_service_descriptors$ = nullptr;
    )cc");
  }

  if (!message_generators_.empty()) {
    std::vector<std::pair<size_t, size_t>> offsets;
    offsets.reserve(message_generators_.size());

    p->Emit(
        {
            {"offsets",
             [&] {
               for (size_t i = 0; i < message_generators_.size(); ++i) {
                 offsets.push_back(message_generators_[i]->GenerateOffsets(p));
               }
             }},
            {"schemas",
             [&] {
               int offset = 0;
               for (size_t i = 0; i < message_generators_.size(); ++i) {
                 message_generators_[i]->GenerateSchema(p, offset,
                                                        offsets[i].second);
                 offset += offsets[i].first;
               }
             }},
        },
        R"cc(
          const ::uint32_t
              $tablename$::offsets[] ABSL_ATTRIBUTE_SECTION_VARIABLE(
                  protodesc_cold) = {
                  $offsets$,
          };

          static const ::_pbi::MigrationSchema
              schemas[] ABSL_ATTRIBUTE_SECTION_VARIABLE(protodesc_cold) = {
                  $schemas$,
          };
        )cc");
    if (!UsingImplicitWeakDescriptor(file_, options_)) {
      p->Emit({{"defaults",
                [&] {
                  for (auto& gen : message_generators_) {
                    p->Emit(
                        {
                            {"ns", Namespace(gen->descriptor(), options_)},
                            {"class", ClassName(gen->descriptor())},
                        },
                        R"cc(
                          &$ns$::_$class$_default_instance_._instance,
                        )cc");
                  }
                }}},
              R"cc(
                static const ::_pb::Message* const file_default_instances[] = {
                    $defaults$,
                };
              )cc");
    }
  } else {
    // Ee still need these symbols to exist.
    //
    // MSVC doesn't like empty arrays, so we add a dummy.
    p->Emit(R"cc(
      const ::uint32_t $tablename$::offsets[1] = {};
      static constexpr ::_pbi::MigrationSchema* schemas = nullptr;
      static constexpr ::_pb::Message* const* file_default_instances = nullptr;
    )cc");
  }

  // ---------------------------------------------------------------

  // Embed the descriptor.  We simply serialize the entire
  // FileDescriptorProto/ and embed it as a string literal, which is parsed and
  // built into real descriptors at initialization time.

  FileDescriptorProto file_proto = StripSourceRetentionOptions(*file_);
  std::string file_data;
  file_proto.SerializeToString(&file_data);

  auto desc_name = UniqueName("descriptor_table_protodef", file_, options_);
  p->Emit(
      {{"desc_name", desc_name},
       {"encoded_file_proto",
        [&] {
          if (options_.strip_nonfunctional_codegen) {
            p->Emit(R"cc("")cc");
            return;
          }

          absl::string_view data = file_data;
          if (data.size() <= 65535) {
            static constexpr size_t kBytesPerLine = 40;
            while (!data.empty()) {
              auto to_write = std::min(kBytesPerLine, data.size());
              auto chunk = data.substr(0, to_write);
              data = data.substr(to_write);

              p->Emit({{"text", EscapeTrigraphs(absl::CEscape(chunk))}}, R"cc(
                "$text$"
              )cc");
            }
            return;
          }

          // Workaround for MSVC: "Error C1091: compiler limit: string exceeds
          // 65535 bytes in length". Declare a static array of chars rather than
          // use a string literal. Only write 25 bytes per line.
          static constexpr size_t kBytesPerLine = 25;
          while (!data.empty()) {
            auto to_write = std::min(kBytesPerLine, data.size());
            auto chunk = data.substr(0, to_write);
            data = data.substr(to_write);

            std::string line;
            for (char c : chunk) {
              absl::StrAppend(&line, "'",
                              absl::CEscape(absl::string_view(&c, 1)), "', ");
            }

            p->Emit({{"line", line}}, R"cc(
              $line$
            )cc");
          }
        }}},
      R"cc(
        const char $desc_name$[] ABSL_ATTRIBUTE_SECTION_VARIABLE(
            protodesc_cold) = {
            $encoded_file_proto$,
        };
      )cc");

  CrossFileReferences refs;
  GetCrossFileReferencesForFile(file_, &refs);
  size_t num_deps =
      refs.strong_reflection_files.size() + refs.weak_reflection_files.size();

  // Build array of DescriptorTable deps.
  if (num_deps > 0) {
    p->Emit(
        {
            {"len", num_deps},
            {"deps",
             [&] {
               for (auto dep : refs.strong_reflection_files) {
                 p->Emit({{"name", DescriptorTableName(dep, options_)}}, R"cc(
                   &::$name$,
                 )cc");
               }
               for (auto dep : refs.weak_reflection_files) {
                 p->Emit({{"name", DescriptorTableName(dep, options_)}}, R"cc(
                   &::$name$,
                 )cc");
               }
             }},
        },
        R"cc(
          static const ::_pbi::DescriptorTable* const $desc_table$_deps[$len$] =
              {
                  $deps$,
          };
        )cc");
  }

  // The DescriptorTable itself.
  // Should be "bool eager = NeedsEagerDescriptorAssignment(file_, options_);"
  // however this might cause a tsan failure in superroot b/148382879,
  // so disable for now.
  bool eager = false;
  p->Emit(
      {
          {"eager", eager ? "true" : "false"},
          {"file_proto_len",
           options_.strip_nonfunctional_codegen ? 0 : file_data.size()},
          {"proto_name", desc_name},
          {"deps_ptr", num_deps == 0
                           ? "nullptr"
                           : absl::StrCat(p->LookupVar("desc_table"), "_deps")},
          {"num_deps", num_deps},
          {"num_msgs", message_generators_.size()},
      },
      R"cc(
        static ::absl::once_flag $desc_table$_once;
        PROTOBUF_CONSTINIT const ::_pbi::DescriptorTable $desc_table$ = {
            false,
            $eager$,
            $file_proto_len$,
            $proto_name$,
            "$filename$",
            &$desc_table$_once,
            $deps_ptr$,
            $num_deps$,
            $num_msgs$,
            schemas,
            file_default_instances,
            $tablename$::offsets,
            $file_level_enum_descriptors$,
            $file_level_service_descriptors$,
        };
      )cc");

  // For descriptor.proto and cpp_features.proto we want to avoid doing any
  // dynamic initialization, because in some situations that would otherwise
  // pull in a lot of unnecessary code that can't be stripped by --gc-sections.
  // Descriptor initialization will still be performed lazily when it's needed.
  if (!IsLazilyInitializedFile(file_->name())) {
    if (UsingImplicitWeakDescriptor(file_, options_)) {
      for (auto* pinned :
           GetMessagesToPinGloballyForWeakDescriptors(file_, options_)) {
        static_initializers_[kInitPriority102].push_back([this,
                                                          pinned](auto* p) {
          p->Emit({{"pin", StrongReferenceToType(pinned, options_)}},
                  R"cc(
                    $pin$,
                  )cc");
        });
      }
    }
    static_initializers_[kInitPriority102].push_back([](auto* p) {
      p->Emit(R"cc(
        ::_pbi::AddDescriptors(&$desc_table$),
      )cc");
    });
  }

  // However, we must provide a way to force initialize the default instances
  // of FileDescriptorProto which will be used during registration of other
  // files.
  if (IsFileDescriptorProto(file_, options_)) {
    NamespaceOpener ns(p);
    ns.ChangeTo(absl::StrCat(ProtobufNamespace(options_), "::internal"));
    p->Emit(
        {{"dummy", UniqueName("dynamic_init_dummy", file_, options_)},
         {"initializers", absl::StrJoin(message_generators_, "\n",
                                        [&](std::string* out, const auto& gen) {
                                          absl::StrAppend(
                                              out,
                                              DefaultInstanceName(
                                                  gen->descriptor(), options_),
                                              ".Init();");
                                        })}},
        R"cc(
          //~ Emit wants an indented line, so give it a comment to strip.
#if !defined(PROTOBUF_CONSTINIT_DEFAULT_INSTANCES)
          PROTOBUF_EXPORT void InitializeFileDescriptorDefaultInstancesSlow() {
            $initializers$;
          }
          PROTOBUF_ATTRIBUTE_INIT_PRIORITY1
          static std::true_type $dummy${
              (InitializeFileDescriptorDefaultInstances(), std::true_type{})};
#endif  // !defined(PROTOBUF_CONSTINIT_DEFAULT_INSTANCES)
        )cc");
  }
}